

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inverse_mglsa_digital_filter.cc
# Opt level: O3

bool __thiscall
sptk::InverseMglsaDigitalFilter::Run
          (InverseMglsaDigitalFilter *this,
          vector<double,_std::allocator<double>_> *filter_coefficients,double filter_input,
          double *filter_output,Buffer *buffer)

{
  vector<double,_std::allocator<double>_> *this_00;
  uint uVar1;
  int iVar2;
  pointer pdVar3;
  pointer pdVar4;
  bool bVar5;
  ulong uVar6;
  double *pdVar7;
  long lVar8;
  double *pdVar9;
  long lVar10;
  ulong uVar11;
  pointer pdVar12;
  size_type sVar13;
  size_type sVar14;
  pointer pdVar15;
  long lVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  
  if (this->is_valid_ == true) {
    bVar5 = false;
    if ((buffer != (Buffer *)0x0) && (bVar5 = false, filter_output != (double *)0x0)) {
      pdVar7 = (filter_coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar9 = (filter_coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      sVar13 = (long)pdVar9 - (long)pdVar7 >> 3;
      sVar14 = (long)this->num_filter_order_ + 1;
      bVar5 = false;
      if (sVar13 == sVar14) {
        if (this->num_stage_ == 0) {
          this_00 = &buffer->inverse_filter_coefficients_;
          pdVar15 = (buffer->inverse_filter_coefficients_).
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if ((long)(buffer->inverse_filter_coefficients_).
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)pdVar15 != (long)pdVar9 - (long)pdVar7
             ) {
            std::vector<double,_std::allocator<double>_>::resize
                      ((vector<double,_std::allocator<double>_> *)this_00,sVar13);
            pdVar7 = (filter_coefficients->super__Vector_base<double,_std::allocator<double>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            pdVar9 = (filter_coefficients->super__Vector_base<double,_std::allocator<double>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
            pdVar15 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start;
          }
          for (; pdVar7 != pdVar9; pdVar7 = pdVar7 + 1) {
            *pdVar15 = -*pdVar7;
            pdVar15 = pdVar15 + 1;
          }
          bVar5 = MlsaDigitalFilter::Run
                            (&this->mlsa_digital_filter_,
                             (vector<double,_std::allocator<double>_> *)this_00,filter_input,
                             filter_output,&buffer->mlsa_digital_filter_buffer_);
          return bVar5;
        }
        sVar13 = (size_type)(this->num_stage_ * (int)sVar14);
        if ((long)(buffer->signals_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(buffer->signals_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3 != sVar13) {
          std::vector<double,_std::allocator<double>_>::resize
                    ((vector<double,_std::allocator<double>_> *)&buffer->signals_,sVar13);
          pdVar15 = (buffer->signals_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pdVar3 = (buffer->signals_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          if (pdVar15 != pdVar3) {
            memset(pdVar15,0,((long)pdVar3 + (-8 - (long)pdVar15) & 0xfffffffffffffff8U) + 8);
          }
        }
        dVar17 = exp(-*(filter_coefficients->super__Vector_base<double,_std::allocator<double>_>).
                       _M_impl.super__Vector_impl_data._M_start);
        dVar17 = dVar17 * filter_input;
        uVar1 = this->num_filter_order_;
        uVar6 = (ulong)uVar1;
        if ((uVar6 != 0) && (iVar2 = this->num_stage_, 0 < (long)iVar2)) {
          lVar8 = (long)(int)uVar1;
          pdVar3 = (filter_coefficients->super__Vector_base<double,_std::allocator<double>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          dVar18 = 1.0 - this->alpha_ * this->alpha_;
          pdVar4 = (buffer->signals_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          bVar5 = this->transposition_;
          pdVar15 = pdVar4 + 2;
          lVar16 = 0;
          pdVar12 = pdVar4;
          do {
            pdVar7 = pdVar4 + lVar16 * (lVar8 + 1);
            dVar19 = *pdVar7;
            if (bVar5 == false) {
              dVar19 = dVar19 * pdVar3[1];
              if (1 < (int)uVar1) {
                dVar20 = *(pointer)((long)pdVar4 + (lVar8 * 8 + 8) * lVar16);
                lVar10 = 0;
                dVar21 = pdVar7[1];
                do {
                  pdVar9 = pdVar15 + lVar10;
                  dVar20 = (*pdVar9 - dVar20) * this->alpha_ + dVar21;
                  pdVar15[lVar10 + -1] = dVar20;
                  dVar19 = dVar19 + pdVar3[lVar10 + 2] * dVar20;
                  lVar10 = lVar10 + 1;
                  dVar21 = *pdVar9;
                } while (uVar6 - 1 != lVar10);
              }
              lVar10 = uVar6 + 1;
              if (0 < (int)uVar1) {
                do {
                  pdVar12[lVar10 + -1] = pdVar12[lVar10 + -2];
                  lVar10 = lVar10 + -1;
                } while (1 < lVar10);
              }
              *pdVar7 = this->alpha_ * *pdVar7 + dVar17 * dVar18;
              dVar17 = dVar19 + dVar17;
            }
            else {
              pdVar7[lVar8] = pdVar3[lVar8] * dVar17 + this->alpha_ * pdVar7[lVar8 + -1];
              if (1 < (int)uVar1) {
                dVar20 = pdVar7[uVar6];
                lVar10 = uVar6 + 1;
                do {
                  dVar20 = pdVar3[lVar10 + -2] * dVar17 +
                           (pdVar12[lVar10 + -3] - dVar20) * this->alpha_ + pdVar12[lVar10 + -2];
                  pdVar12[lVar10 + -2] = dVar20;
                  lVar10 = lVar10 + -1;
                } while (2 < lVar10);
              }
              dVar17 = dVar19 * dVar18 + dVar17;
              if (0 < (int)uVar1) {
                uVar11 = 0;
                do {
                  pdVar12[uVar11] = pdVar12[uVar11 + 1];
                  uVar11 = uVar11 + 1;
                } while (uVar6 != uVar11);
              }
            }
            lVar16 = lVar16 + 1;
            pdVar15 = pdVar15 + lVar8 + 1;
            pdVar12 = pdVar12 + lVar8 + 1;
          } while (lVar16 != iVar2);
        }
        *filter_output = dVar17;
        bVar5 = true;
      }
    }
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool InverseMglsaDigitalFilter::Run(
    const std::vector<double>& filter_coefficients, double filter_input,
    double* filter_output, InverseMglsaDigitalFilter::Buffer* buffer) const {
  // Check inputs.
  if (!is_valid_ ||
      filter_coefficients.size() !=
          static_cast<std::size_t>(num_filter_order_ + 1) ||
      NULL == filter_output || NULL == buffer) {
    return false;
  }

  // Use inverse MLSA filter.
  if (0 == num_stage_) {
    if (buffer->inverse_filter_coefficients_.size() !=
        static_cast<std::size_t>(num_filter_order_ + 1)) {
      buffer->inverse_filter_coefficients_.resize(num_filter_order_ + 1);
    }
    std::transform(filter_coefficients.begin(), filter_coefficients.end(),
                   buffer->inverse_filter_coefficients_.begin(),
                   std::negate<double>());
    return mlsa_digital_filter_.Run(buffer->inverse_filter_coefficients_,
                                    filter_input, filter_output,
                                    &buffer->mlsa_digital_filter_buffer_);
  }

  // Prepare memories.
  if (buffer->signals_.size() !=
      static_cast<std::size_t>((num_filter_order_ + 1) * num_stage_)) {
    buffer->signals_.resize((num_filter_order_ + 1) * num_stage_);
    std::fill(buffer->signals_.begin(), buffer->signals_.end(), 0.0);
  }

  const double gained_input(filter_input * std::exp(-filter_coefficients[0]));
  if (0 == num_filter_order_) {
    *filter_output = gained_input;
    return true;
  }

  const double* b(&(filter_coefficients[1]));
  const double beta(1.0 - alpha_ * alpha_);
  double x(gained_input);

  for (int i(0); i < num_stage_; ++i) {
    double* d(&buffer->signals_[(num_filter_order_ + 1) * i]);
    if (transposition_) {
      const double y(x + beta * d[0]);
      d[num_filter_order_] =
          b[num_filter_order_ - 1] * x + alpha_ * d[num_filter_order_ - 1];
      for (int j(num_filter_order_ - 1); 0 < j; --j) {
        d[j] += b[j - 1] * x + alpha_ * (d[j - 1] - d[j + 1]);
      }

      for (int j(0); j < num_filter_order_; ++j) {
        d[j] = d[j + 1];
      }

      x = y;
    } else {
      double y(d[0] * b[0]);
      for (int j(1); j < num_filter_order_; ++j) {
        d[j] += alpha_ * (d[j + 1] - d[j - 1]);
        y += d[j] * b[j];
      }
      y += x;

      for (int j(num_filter_order_); 0 < j; --j) {
        d[j] = d[j - 1];
      }
      d[0] = alpha_ * d[0] + beta * x;

      x = y;
    }
  }

  *filter_output = x;

  return true;
}